

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O3

bool __thiscall
dlib::thread_pool_implementation::is_worker_thread
          (thread_pool_implementation *this,thread_id_type id)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = (this->worker_thread_ids).array_size;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      if ((this->worker_thread_ids).array_elements[sVar2] == id) {
        return true;
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return (this->tasks).array_size == 0;
}

Assistant:

bool thread_pool_implementation::
    is_worker_thread (
        const thread_id_type id
    ) const
    {
        for (unsigned long i = 0; i < worker_thread_ids.size(); ++i)
        {
            if (worker_thread_ids[i] == id)
                return true;
        }

        // if there aren't any threads in the pool then we consider all threads
        // to be worker threads
        if (tasks.size() == 0)
            return true;
        else
            return false;
    }